

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

void cancel_item(obj *obj)

{
  obj *poVar1;
  char cVar2;
  boolean bVar3;
  short sVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char buf [256];
  
  bVar8 = uleft == obj;
  bVar9 = uright == obj;
  sVar4 = obj->otyp;
  bVar10 = true;
  switch(sVar4) {
  case 0x92:
    if (((obj->owornmask & 0x10) != 0) && (uarmg == obj)) {
LAB_0027d110:
      u.abon.a[3] = u.abon.a[3] - obj->spe;
LAB_0027d187:
      iflags.botl = '\x01';
    }
    break;
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
    break;
  case 0x9d:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.abon.a[5] = u.abon.a[5] - obj->spe;
      goto LAB_0027d187;
    }
    break;
  case 0x9e:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.abon.a[0] = u.abon.a[0] - obj->spe;
      goto LAB_0027d187;
    }
    break;
  case 0x9f:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.abon.a[4] = u.abon.a[4] - obj->spe;
      goto LAB_0027d187;
    }
    break;
  case 0xa0:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      goto LAB_0027d187;
    }
    break;
  case 0xa1:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      cVar2 = obj->spe;
LAB_0027d181:
      u.abon.a[2] = u.abon.a[2] - cVar2;
      goto LAB_0027d187;
    }
    break;
  case 0xa2:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) goto LAB_0027d110;
    break;
  case 0xa3:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.uhitinc = u.uhitinc - obj->spe;
    }
    break;
  case 0xa4:
    if ((obj->owornmask & 0x60000) != 0 && (bVar8 || bVar9)) {
      u.udaminc = u.udaminc - obj->spe;
    }
    break;
  default:
    if (sVar4 == 0x51) {
      if (((obj->owornmask & 4) != 0) && (uarmh == obj)) {
        u.abon.a[1] = u.abon.a[1] - obj->spe;
        cVar2 = obj->spe;
        goto LAB_0027d181;
      }
    }
    else if (sVar4 == 0x14f) {
      bVar10 = (obj->field_0x4a & 2) == 0;
    }
  }
  bVar3 = equip_is_worn(obj);
  poVar1 = uarm;
  if ((bVar3 != '\0') && (obj->spe != '\0')) {
    uVar7 = (uint)obj->oprops;
    if ((uVar7 >> 8 & 1) != 0) {
      u.abon.a[3] = u.abon.a[3] - obj->spe;
      iflags.botl = '\x01';
      uVar7 = (uint)obj->oprops;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      u.abon.a[2] = u.abon.a[2] - obj->spe;
      iflags.botl = '\x01';
    }
  }
  sVar4 = obj->otyp;
  if ((ushort)(sVar4 - 0x54U) < 0xb) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027d231;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027d22c;
LAB_0027d264:
      pcVar5 = Shk_Your(buf,obj);
      pcVar6 = xname(obj);
      pline("%s %s reverts to its natural form!",pcVar5,pcVar6);
LAB_0027d29e:
      costly_cancel(obj);
      if (poVar1 == obj) {
        setworn((obj *)0x0,1);
        obj->otyp = obj->otyp + 0xb;
        setworn(obj,1);
        sVar4 = obj->otyp;
        goto LAB_0027d2da;
      }
    }
    else {
LAB_0027d22c:
      if (ublindf != (obj *)0x0) {
LAB_0027d231:
        if (ublindf->oartifact == '\x1d') goto LAB_0027d264;
      }
      if (uarm == obj) {
        pline("Your armor feels looser.");
        goto LAB_0027d29e;
      }
      costly_cancel(obj);
    }
    sVar4 = obj->otyp + 0xb;
    obj->otyp = sVar4;
  }
LAB_0027d2da:
  if ((((objects[sVar4].field_0x10 & 0x10) != 0) ||
      (((obj->spe != '\0' &&
        (((byte)obj->oclass - 2 < 2 || ((obj->oclass == 6 && (objects[sVar4].oc_subtyp != '\0'))))))
       || (sVar4 == 0x141)))) || (sVar4 == 0x13f)) {
    cVar2 = obj->oclass;
    if ((((obj->spe != -(cVar2 == '\v')) && (sVar4 != 0xe9)) && (sVar4 != 0x10b)) &&
       (sVar4 != 0x1ca)) {
      costly_cancel(obj);
      cVar2 = obj->oclass;
      obj->spe = -(cVar2 == '\v');
    }
    if (cVar2 == '\b') {
      costly_cancel(obj);
      sVar4 = obj->otyp;
      if (sVar4 != 0x130) {
        if (sVar4 == 0x151) {
          obj->otyp = 0x150;
          goto LAB_0027d3f9;
        }
        if (sVar4 != 0x13f) {
          obj->otyp = 0x14f;
          obj->field_0x4b = obj->field_0x4b & 0xfc;
          goto LAB_0027d3f9;
        }
      }
      obj->otyp = 0x140;
    }
    else if (cVar2 == '\n') {
      if ((obj->otyp != 0x1a1) && (obj->otyp != 0x1bd)) {
        costly_cancel(obj);
        obj->otyp = 0x1bc;
      }
    }
    else if (cVar2 == '\t') {
      costly_cancel(obj);
      obj->otyp = 0x17c;
      obj->spe = '\0';
    }
  }
LAB_0027d3f9:
  if (!bVar10) {
    costly_cancel(obj);
  }
  unbless(obj);
  uncurse(obj);
  return;
}

Assistant:

void cancel_item(struct obj *obj)
{
	boolean	u_ring = (obj == uleft) || (obj == uright);
	boolean holy = (obj->otyp == POT_WATER && obj->blessed);

	switch(obj->otyp) {
		case RIN_GAIN_STRENGTH:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_STR) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_CONSTITUTION:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CON) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_INTELLIGENCE:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_INT) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_WISDOM:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_DEXTERITY:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_ADORNMENT:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CHA) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_INCREASE_ACCURACY:
			if ((obj->owornmask & W_RING) && u_ring)
				u.uhitinc -= obj->spe;
			break;
		case RIN_INCREASE_DAMAGE:
			if ((obj->owornmask & W_RING) && u_ring)
				u.udaminc -= obj->spe;
			break;
		case GAUNTLETS_OF_DEXTERITY:
			if ((obj->owornmask & W_ARMG) && (obj == uarmg)) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case HELM_OF_BRILLIANCE:
			if ((obj->owornmask & W_ARMH) && (obj == uarmh)) {
				ABON(A_INT) -= obj->spe;
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		/* case RIN_PROTECTION:  not needed */
	}

	if (equip_is_worn(obj) && obj->spe) {
	    if (obj->oprops & ITEM_DEXTERITY) {
		ABON(A_DEX) -= obj->spe;
		iflags.botl = 1;
	    }

	    if (obj->oprops & ITEM_BRILLIANCE) {
		ABON(A_INT) -= obj->spe;
		ABON(A_WIS) -= obj->spe;
		iflags.botl = 1;
	    }
	}

	/* MRKR: Cancelled *DSM reverts to scales.  */
	/*       Suggested by Daniel Morris in RGRN */

	if (obj->otyp >= GRAY_DRAGON_SCALE_MAIL &&
	    obj->otyp <= CHROMATIC_DRAGON_SCALE_MAIL) {
		/* dragon scale mail reverts to dragon scales */
		boolean worn = (obj == uarm);

		if (!Blind) {
			char buf[BUFSZ];
			pline("%s %s reverts to its natural form!",
			      Shk_Your(buf, obj), xname(obj));
		} else if (worn) {
			pline("Your armor feels looser.");
		}
		costly_cancel(obj);

		if (worn)
			setworn(NULL, W_ARM);

		/* assumes same order */
		obj->otyp = GRAY_DRAGON_SCALES +
			    obj->otyp - GRAY_DRAGON_SCALE_MAIL;

		if (worn)
			setworn(obj, W_ARM);
	}

	if (objects[obj->otyp].oc_magic
	    || (obj->spe && (obj->oclass == ARMOR_CLASS ||
			     obj->oclass == WEAPON_CLASS || is_weptool(obj)))
	    || obj->otyp == POT_ACID || obj->otyp == POT_SICKNESS) {
	    if (obj->spe != ((obj->oclass == WAND_CLASS) ? -1 : 0) &&
	       obj->otyp != WAN_CANCELLATION &&
		 /* can't cancel cancellation */
		 obj->otyp != MAGIC_LAMP &&
		 obj->otyp != CANDELABRUM_OF_INVOCATION) {
		costly_cancel(obj);
		obj->spe = (obj->oclass == WAND_CLASS) ? -1 : 0;
	    }
	    switch (obj->oclass) {
	      case SCROLL_CLASS:
		costly_cancel(obj);
		obj->otyp = SCR_BLANK_PAPER;
		obj->spe = 0;
		break;
	      case SPBOOK_CLASS:
		if (obj->otyp != SPE_CANCELLATION &&
			obj->otyp != SPE_BOOK_OF_THE_DEAD) {
		    costly_cancel(obj);
		    obj->otyp = SPE_BLANK_PAPER;
		}
		break;
	      case POTION_CLASS:
		costly_cancel(obj);
		if (obj->otyp == POT_SICKNESS ||
		    obj->otyp == POT_SEE_INVISIBLE) {
	    /* sickness is "biologically contaminated" fruit juice; cancel it
	     * and it just becomes fruit juice... whereas see invisible
	     * tastes like "enchanted" fruit juice, it similarly cancels.
	     */
		    obj->otyp = POT_FRUIT_JUICE;
		} else if (obj->otyp == POT_VAMPIRE_BLOOD) {
		    obj->otyp = POT_BLOOD;
		} else {
	            obj->otyp = POT_WATER;
		    obj->odiluted = 0; /* same as any other water */
		}
		break;
	    }
	}
	if (holy) costly_cancel(obj);
	unbless(obj);
	uncurse(obj);
#ifdef INVISIBLE_OBJECTS
	if (obj->oinvis) obj->oinvis = 0;
#endif
	return;
}